

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O2

int lib_atoi(char *str,size_t len)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  
  iVar1 = 1;
  iVar3 = 0;
  if (len == 0) {
    len = 0;
  }
  else if (*str == '+') {
    str = str + 1;
    len = len - 1;
  }
  else if (*str == '-') {
    str = str + 1;
    len = len - 1;
    iVar1 = -1;
  }
  sVar2 = 0;
  while ((len != sVar2 && ((int)str[sVar2] - 0x30U < 10))) {
    iVar3 = ((int)str[sVar2] - 0x30U) + iVar3 * 10;
    sVar2 = sVar2 + 1;
  }
  return iVar3 * iVar1;
}

Assistant:

int lib_atoi(const char *str, size_t len)
{
    /* parse the sign, if present */
    int s = 1;
    if (len >= 1 && *str == '-')
        s = -1, ++str, --len;
    else if (len >= 1 && *str == '+')
        ++str, --len;

    /* scan digits */
    int acc;
    for (acc = 0 ; len > 0 && is_digit(*str) ;
         acc *= 10, acc += value_of_digit(*str), ++str, --len) ;

    /* apply the sign and return the result */
    return s * acc;
}